

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

double __thiscall sophia_interface::ULMASS(sophia_interface *this,int KF)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  __type _Var4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_c8;
  double local_c0;
  double local_b8;
  double PMUPP;
  double local_a8;
  double local_a0;
  double PMLOW;
  double PM0;
  double local_88;
  int local_7c;
  double dStack_78;
  int KMUL;
  double PMSPL;
  double PMC;
  double PMB;
  double PMA;
  int local_50;
  int KFLR;
  int KFLS;
  int KFLC;
  int KFLB;
  int KFLA;
  double local_38;
  int local_30;
  int local_2c;
  int KC;
  int KFA;
  double result;
  sophia_interface *psStack_18;
  int KF_local;
  sophia_interface *this_local;
  
  _KC = (sophia_interface *)0x0;
  local_2c = KF;
  if (KF < 1) {
    local_2c = -KF;
  }
  result._4_4_ = KF;
  psStack_18 = this;
  local_30 = LUCOMP(this,KF);
  if (local_30 == 0) {
    this_local = (sophia_interface *)0x0;
  }
  else {
    PARF[0x69] = PMAS[0][5];
    PARF[0x6a] = PMAS[0][6];
    PARF[0x6b] = PMAS[0][7];
    if (((MSTJ[0x5c] == 1) || (MSTJ[0x5c] == 2)) && (local_2c < 0xb)) {
      _KC = (sophia_interface *)PARF[local_2c + 99];
      if (MSTJ[0x5c] == 2) {
        local_38 = 0.0;
        _KFLB = (double)_KC - PARF[0x78];
        pdVar1 = std::max<double>(&local_38,(double *)&KFLB);
        _KC = (sophia_interface *)*pdVar1;
      }
    }
    else if (((local_2c < 0x65) || (local_30 < 0x51)) || (100 < local_30)) {
      _KC = (sophia_interface *)PMAS[0][local_30 + -1];
    }
    else {
      KFLC = (int)((long)((ulong)(uint)((int)((long)local_2c / 1000) >> 0x1f) << 0x20 |
                         (long)local_2c / 1000 & 0xffffffffU) % 10);
      KFLS = (int)((long)((ulong)(uint)((int)((long)local_2c / 100) >> 0x1f) << 0x20 |
                         (long)local_2c / 100 & 0xffffffffU) % 10);
      KFLR = (int)((long)((ulong)(uint)((int)((long)local_2c / 10) >> 0x1f) << 0x20 |
                         (long)local_2c / 10 & 0xffffffffU) % 10);
      local_50 = local_2c % 10;
      PMA._4_4_ = (int)((long)((ulong)(uint)((int)((long)local_2c / 10000) >> 0x1f) << 0x20 |
                              (long)local_2c / 10000 & 0xffffffffU) % 10);
      PMB = PARF[KFLC + 99];
      PMC = PARF[KFLS + 99];
      PMSPL = PARF[KFLR + 99];
      dStack_78 = 0.0;
      if (((KFLC == 0) && (PMA._4_4_ == 0)) && (local_50 < 4)) {
        if (local_50 == 1) {
          dStack_78 = -3.0 / (PMC * PMSPL);
        }
        if (2 < local_50) {
          dStack_78 = 1.0 / (PMC * PMSPL);
        }
        _KC = (sophia_interface *)
              (PARF[0x70] * PARF[100] * PARF[100] * dStack_78 + PARF[0x6e] + PMC + PMSPL);
      }
      else if (KFLC == 0) {
        local_7c = 2;
        if (local_50 == 1) {
          local_7c = 3;
        }
        if (PMA._4_4_ == 2) {
          local_7c = 4;
        }
        if (local_50 == 5) {
          local_7c = 5;
        }
        _KC = (sophia_interface *)(PARF[local_7c + 0x70] + PMC + PMSPL);
      }
      else if (KFLR == 0) {
        if (local_50 == 1) {
          dStack_78 = -3.0 / (PMB * PMC);
        }
        if (local_50 == 3) {
          dStack_78 = 1.0 / (PMB * PMC);
        }
        _KC = (sophia_interface *)
              (PARF[0x71] * PARF[100] * PARF[100] * dStack_78 + (PARF[0x6f] * 2.0) / 3.0 + PMB + PMC
              );
        if (MSTJ[0x5c] == 1) {
          _KC = (sophia_interface *)(PMB + PMC);
        }
        if (MSTJ[0x5c] == 2) {
          local_88 = 0.0;
          PM0 = ((double)_KC - PARF[0x79]) - (PARF[0x6f] * 2.0) / 3.0;
          pdVar1 = std::max<double>(&local_88,&PM0);
          _KC = (sophia_interface *)*pdVar1;
        }
      }
      else {
        if ((local_50 == 2) && (KFLC == KFLS)) {
          dStack_78 = (1.0 / (PMB * PMC) - 2.0 / (PMB * PMSPL)) - 2.0 / (PMC * PMSPL);
        }
        else if ((local_50 == 2) && (KFLR <= KFLS)) {
          dStack_78 = (-2.0 / (PMB * PMC) - 2.0 / (PMB * PMSPL)) + 1.0 / (PMC * PMSPL);
        }
        else if (local_50 == 2) {
          dStack_78 = -3.0 / (PMC * PMSPL);
        }
        else {
          dStack_78 = 1.0 / (PMB * PMC) + 1.0 / (PMB * PMSPL) + 1.0 / (PMC * PMSPL);
        }
        _KC = (sophia_interface *)
              (PARF[0x71] * PARF[100] * PARF[100] * dStack_78 + PARF[0x6f] + PMB + PMC + PMSPL);
      }
    }
    if ((0 < MSTJ[0x17]) && (0.0001 < PMAS[1][local_30 + -1])) {
      if ((MSTJ[0x17] == 1) || ((MSTJ[0x17] == 2 && (100 < local_2c)))) {
        dVar7 = PMAS[1][local_30 + -1];
        dVar2 = RLU(this,false);
        dVar3 = atan((PMAS[2][local_30 + -1] * 2.0) / PMAS[1][local_30 + -1]);
        dVar2 = tan((dVar2 + dVar2 + -1.0) * dVar3);
        _KC = (sophia_interface *)(dVar7 * 0.5 * dVar2 + (double)_KC);
      }
      else {
        PMLOW = (double)_KC;
        local_a8 = 0.0;
        PMUPP = (double)_KC - PMAS[2][local_30 + -1];
        pdVar1 = std::max<double>(&local_a8,&PMUPP);
        _Var4 = std::pow<double,int>(*pdVar1,2);
        local_a0 = atan((-PMLOW * PMLOW + _Var4) / (PMLOW * PMAS[1][local_30 + -1]));
        _Var4 = std::pow<double,int>(PMLOW + PMAS[2][local_30 + -1],2);
        local_b8 = atan((-PMLOW * PMLOW + _Var4) / (PMLOW * PMAS[1][local_30 + -1]));
        dVar2 = PMLOW;
        dVar7 = local_a0;
        local_c0 = 0.0;
        dVar3 = PMLOW * PMAS[1][local_30 + -1];
        dVar5 = local_b8 - local_a0;
        dVar6 = RLU(this,false);
        dVar7 = tan(dVar5 * dVar6 + dVar7);
        local_c8 = dVar2 * dVar2 + dVar3 * dVar7;
        pdVar1 = std::max<double>(&local_c0,&local_c8);
        _KC = (sophia_interface *)sqrt(*pdVar1);
      }
    }
    MSTJ[0x5c] = 0;
    this_local = _KC;
  }
  return (double)this_local;
}

Assistant:

double sophia_interface::ULMASS(int KF) {
// Purpose: to give the mass of a particle/parton.
    double result = 0.;
    int KFA = std::abs(KF);
    int KC = LUCOMP(KF);
    if (KC == 0) return 0;
    PARF[105] = PMAS[0][5];
    PARF[106] = PMAS[0][6];
    PARF[107] = PMAS[0][7];

    // Guarantee use of constituent masses for internal checks.
    if ((MSTJ[92] == 1 || MSTJ[92] == 2) && KFA <= 10) {
        result = PARF[99 + KFA];
        if (MSTJ[92] == 2) result = std::max(0., result - PARF[120]);

    // Masses that can be read directly off table.
    } else if (KFA <= 100 || KC <= 80 || KC > 100) {
        result = PMAS[0][KC - 1];

    // Find constituent partons and their masses.
    } else {
        int KFLA = (KFA / 1000) % 10;
        int KFLB = (KFA / 100) % 10;
        int KFLC = (KFA / 10) % 10;
        int KFLS = KFA % 10;
        int KFLR = (KFA / 10000) % 10;
        double PMA = PARF[99 + KFLA];
        double PMB = PARF[99 + KFLB];
        double PMC = PARF[99 + KFLC];
        double PMSPL = 0.;

        // Construct masses for various meson, diquark and baryon cases.
        if (KFLA == 0 && KFLR == 0 && KFLS <= 3) {
            if (KFLS == 1) PMSPL = -3. / (PMB * PMC);
            if (KFLS >= 3) PMSPL = 1. / (PMB * PMC);
            result = PARF[110] + PMB + PMC + PARF[112] * PARF[100] * PARF[100] * PMSPL;
        } else if (KFLA == 0) {
            int KMUL = 2;
            if (KFLS == 1) KMUL = 3;
            if (KFLR == 2) KMUL = 4;
            if (KFLS == 5) KMUL = 5;
            result = PARF[112 + KMUL] + PMB + PMC;
        } else if (KFLC == 0) {
            if (KFLS == 1) PMSPL = -3. / (PMA * PMB);
            if (KFLS == 3) PMSPL = 1. / (PMA * PMB);
            result = 2. * PARF[111] / 3. + PMA + PMB + PARF[113] * PARF[100] * PARF[100] * PMSPL; 
            if (MSTJ[92] == 1) result = PMA + PMB;
            if (MSTJ[92] == 2) result = std::max(0., result - PARF[121] - 2. * PARF[111] / 3.);
      } else {
            if (KFLS == 2 && KFLA == KFLB) {
                PMSPL = 1. / (PMA * PMB) - 2. / (PMA * PMC) - 2. / (PMB * PMC);
            } else if (KFLS == 2 && KFLB >= KFLC) {
                PMSPL = -2. / (PMA * PMB) - 2. / (PMA * PMC) + 1. / (PMB * PMC);
            } else if (KFLS == 2) {
                PMSPL = -3. / (PMB * PMC);
            } else {
                PMSPL = 1. / (PMA * PMB) + 1. / (PMA * PMC) + 1. / (PMB * PMC);
            }
            result = PARF[111] + PMA + PMB + PMC + PARF[113] * PARF[100] * PARF[100] * PMSPL;
        }
    }

    // Optional mass broadening according to truncated Breit-Wigner (either in m or in m^2).
    if (MSTJ[23] >= 1 && PMAS[1][KC - 1] > 1e-4) {
        if (MSTJ[23] == 1 || (MSTJ[23] == 2 && KFA > 100)) {
            result += 0.5 * PMAS[1][KC - 1] * std::tan((2. * RLU() - 1.) * std::atan(2. * PMAS[2][KC - 1] / PMAS[1][KC - 1]));
        } else {
            double PM0 = result;
            double PMLOW = std::atan((std::pow(std::max(0., PM0 - PMAS[2][KC - 1]), 2) - PM0 * PM0) / (PM0 * PMAS[1][KC - 1]));
            double PMUPP = std::atan((std::pow((PM0 + PMAS[2][KC - 1]), 2) - PM0* PM0) / (PM0 * PMAS[1][KC - 1]));
            result = std::sqrt(std::max(0., PM0 * PM0 + PM0 * PMAS[1][KC - 1] * std::tan(PMLOW + (PMUPP - PMLOW) * RLU())));
        }
    }
    MSTJ[92] = 0;
    return result;
}